

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool run_container_is_subset_array(run_container_t *container1,array_container_t *container2)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int32_t n_runs;
  long lVar9;
  ushort uVar10;
  int iVar11;
  long lVar12;
  ushort uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  
  uVar5 = croaring_hardware_support();
  if ((uVar5 & 2) == 0) {
    uVar5 = croaring_hardware_support();
    if ((uVar5 & 1) == 0) {
      iVar6 = container1->n_runs;
      lVar9 = (long)iVar6;
      if (0 < lVar9) {
        lVar12 = 0;
        do {
          iVar6 = iVar6 + (uint)container1->runs[lVar12].length;
          lVar12 = lVar12 + 1;
        } while (lVar9 != lVar12);
      }
    }
    else {
      iVar6 = _avx2_run_container_cardinality(container1);
    }
  }
  else {
    iVar6 = _avx512_run_container_cardinality(container1);
  }
  iVar2 = container2->cardinality;
  if (iVar2 < iVar6) {
LAB_00114b4a:
    _Var4 = false;
  }
  else {
    if (0 < (long)container1->n_runs) {
      puVar3 = container2->array;
      iVar6 = -1;
      lVar9 = 0;
      do {
        uVar1 = container1->runs[lVar9].value;
        uVar15 = (uint)container1->runs[lVar9].length;
        uVar5 = uVar1 + uVar15;
        iVar7 = iVar6 + 1;
        iVar8 = iVar7;
        iVar16 = iVar7;
        if (iVar7 < iVar2) {
          if (puVar3[iVar7] < uVar1) {
            iVar11 = iVar6 + 2;
            iVar14 = 1;
            if (iVar11 < iVar2) {
              iVar14 = 1;
              do {
                uVar10 = puVar3[iVar11];
                if (uVar1 <= uVar10) goto LAB_00114beb;
                iVar16 = iVar14 * 2;
                iVar11 = iVar7 + iVar14 * 2;
                iVar14 = iVar16;
              } while (iVar11 < iVar2);
            }
            uVar10 = puVar3[(long)iVar2 + -1];
            iVar11 = iVar2 + -1;
LAB_00114beb:
            iVar16 = iVar11;
            if (((uVar10 != uVar1) && (iVar16 = iVar2, uVar1 <= uVar10)) &&
               (iVar16 = iVar11, iVar7 + (iVar14 >> 1) + 1 != iVar11)) {
              iVar14 = (iVar14 >> 1) + iVar7;
              do {
                iVar16 = iVar11 + iVar14 >> 1;
                if (puVar3[iVar16] == uVar1) break;
                iVar17 = iVar16;
                if (puVar3[iVar16] < uVar1) {
                  iVar17 = iVar11;
                  iVar14 = iVar16;
                }
                iVar16 = iVar17;
                iVar11 = iVar17;
              } while (iVar14 + 1 != iVar17);
            }
          }
          uVar10 = (ushort)uVar5;
          if (puVar3[iVar7] < uVar10) {
            iVar6 = iVar6 + 2;
            iVar11 = 1;
            if (iVar6 < iVar2) {
              iVar11 = 1;
              do {
                uVar13 = puVar3[iVar6];
                if (uVar10 <= uVar13) goto LAB_00114c58;
                iVar8 = iVar11 * 2;
                iVar6 = iVar7 + iVar11 * 2;
                iVar11 = iVar8;
              } while (iVar6 < iVar2);
            }
            uVar13 = puVar3[(long)iVar2 + -1];
            iVar6 = iVar2 + -1;
LAB_00114c58:
            iVar8 = iVar6;
            if (uVar13 != uVar10) {
              if (uVar13 < uVar10) goto LAB_00114b4a;
              if ((iVar11 >> 1) + iVar7 + 1 != iVar6) {
                iVar7 = (iVar11 >> 1) + iVar7;
                do {
                  iVar8 = iVar7 + iVar6 >> 1;
                  if (puVar3[iVar8] == uVar10) break;
                  if (uVar10 <= puVar3[iVar8]) {
                    iVar6 = iVar8;
                    iVar8 = iVar7;
                  }
                  iVar7 = iVar8;
                  iVar8 = iVar6;
                } while (iVar7 + 1 != iVar6);
              }
            }
          }
        }
        iVar6 = iVar8;
        if (iVar6 == iVar2) {
          return false;
        }
        if (iVar6 - iVar16 != uVar15) {
          return false;
        }
        if ((puVar3[iVar16] != uVar1) || (uVar5 != puVar3[iVar6])) goto LAB_00114b4a;
        lVar9 = lVar9 + 1;
      } while (lVar9 != container1->n_runs);
    }
    _Var4 = true;
  }
  return _Var4;
}

Assistant:

bool run_container_is_subset_array(const run_container_t* container1,
                                   const array_container_t* container2) {
    if (run_container_cardinality(container1) > container2->cardinality)
        return false;
    int32_t start_pos = -1, stop_pos = -1;
    for (int i = 0; i < container1->n_runs; ++i) {
        int32_t start = container1->runs[i].value;
        int32_t stop = start + container1->runs[i].length;
        start_pos = advanceUntil(container2->array, stop_pos,
                                 container2->cardinality, start);
        stop_pos = advanceUntil(container2->array, stop_pos,
                                container2->cardinality, stop);
        if (stop_pos == container2->cardinality) {
            return false;
        } else if (stop_pos - start_pos != stop - start ||
                   container2->array[start_pos] != start ||
                   container2->array[stop_pos] != stop) {
            return false;
        }
    }
    return true;
}